

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstantArray.cc
# Opt level: O0

LiteralType __thiscall
flow::ConstantArray::makeArrayType(ConstantArray *this,LiteralType elementType)

{
  LiteralType elementType_local;
  ConstantArray *this_local;
  
  switch(elementType) {
  case Void:
  case Boolean:
  case RegExp:
  case Handler:
  case IntArray:
  case StringArray:
  case IPAddrArray:
  case CidrArray:
    abort();
  case Number:
    this_local._4_4_ = IntArray;
    break;
  case String:
    this_local._4_4_ = StringArray;
    break;
  default:
    abort();
  case IPAddress:
    this_local._4_4_ = IPAddrArray;
    break;
  case Cidr:
    this_local._4_4_ = CidrArray;
  }
  return this_local._4_4_;
}

Assistant:

LiteralType ConstantArray::makeArrayType(LiteralType elementType) {
  switch (elementType) {
    case LiteralType::Number:
      return LiteralType::IntArray;
    case LiteralType::String:
      return LiteralType::StringArray;
    case LiteralType::IPAddress:
      return LiteralType::IPAddrArray;
    case LiteralType::Cidr:
      return LiteralType::CidrArray;
    case LiteralType::Boolean:
    case LiteralType::RegExp:
    case LiteralType::Handler:
    case LiteralType::IntArray:
    case LiteralType::StringArray:
    case LiteralType::IPAddrArray:
    case LiteralType::CidrArray:
    case LiteralType::Void:
      abort();
    default:
      abort();
  }
}